

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadColumnSizes<true>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  int num_sizes;
  int local_2c;
  
  iVar3 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars + -1;
  local_2c = iVar3;
  iVar1 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
  if (iVar1 != iVar3) {
    TextReader<fmt::Locale>::ReportError<int>(this->reader_,(CStringRef)0x21c0e0,&local_2c);
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  iVar1 = 0;
  for (iVar3 = 0; iVar3 < local_2c; iVar3 = iVar3 + 1) {
    iVar2 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
    if (iVar2 < iVar1) {
      TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x21767a);
    }
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    iVar1 = iVar2;
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}